

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_poll_add_read(intptr_t fd)

{
  int __epfd;
  int iVar1;
  int *piVar2;
  int __fd;
  uint32_t local_2c;
  int local_28;
  
  __epfd = evio_fd[1];
  piVar2 = __errno_location();
  do {
    *piVar2 = 0;
    local_2c = 0x40002011;
    __fd = (int)fd;
    local_28 = __fd;
    iVar1 = epoll_ctl(__epfd,3,__fd,(epoll_event *)&local_2c);
    if (iVar1 == -1) {
      iVar1 = *piVar2;
      if (iVar1 == 2) {
        *piVar2 = 0;
        local_2c = 0x40002011;
        local_28 = __fd;
        epoll_ctl(__epfd,1,__fd,(epoll_event *)&local_2c);
        goto LAB_0013b038;
      }
    }
    else {
LAB_0013b038:
      iVar1 = *piVar2;
    }
    if (iVar1 != 4) {
      return;
    }
  } while( true );
}

Assistant:

static inline void fio_poll_add_read(intptr_t fd) {
  fio_poll_add2(fd, (EPOLLIN | EPOLLRDHUP | EPOLLHUP | EPOLLONESHOT),
                evio_fd[1]);
  return;
}